

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupSpreadFlop(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  Gia_Obj_t *pObj;
  int iVar12;
  long lVar13;
  long lVar14;
  
  if (vFfMask->nSize < p->nRegs) {
    __assert_fail("Vec_IntSize(vFfMask) >= Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x379,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pName = pcVar5;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar9 <= lVar13) goto LAB_001db7ac;
      iVar12 = pVVar8->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_001db78d;
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar9 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_001db76e;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar6 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar6)) goto LAB_001db76e;
      pGVar7[iVar12].Value = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCis;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar13 < (long)(uVar9 - (long)p->nRegs));
  }
  if (vFfMask->nSize < 1) {
    iVar12 = 0;
  }
  else {
    lVar13 = 0;
    iVar12 = 0;
    do {
      iVar11 = vFfMask->pArray[lVar13];
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar9 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar9 | 0x9fffffff;
      uVar9 = uVar9 & 0xe0000000ffffffff | 0x9fffffff;
      if (iVar11 == -1) {
        *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar9;
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_001db76e;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
        if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_001db76e;
      }
      else {
        *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar9;
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_001db76e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_001db76e;
        if (p->nRegs <= iVar12) {
          __assert_fail("v < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d6,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
        }
        iVar11 = p->vCis->nSize;
        uVar10 = (iVar11 - p->nRegs) + iVar12;
        if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_001db7ac;
        iVar11 = p->vCis->pArray[uVar10];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001db78d;
        iVar12 = iVar12 + 1;
        p->pObjs[iVar11].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < vFfMask->nSize);
  }
  if (iVar12 != p->nRegs) {
    __assert_fail("k == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x386,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  if (0 < p->nObjs) {
    lVar13 = 8;
    lVar14 = 0;
    do {
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)((long)pGVar7 + lVar13 + -8);
      if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        uVar10 = *(uint *)((long)pGVar7 +
                          lVar13 + (ulong)(uint)((int)(uVar9 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar1 = *(uint *)((long)pGVar7 +
                             lVar13 + (ulong)((uint)(uVar9 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001db7cb;
        iVar12 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar9 >> 0x1d) & 1,
                                  uVar1 ^ (uint)(uVar9 >> 0x3d) & 1);
        *(int *)(&pGVar7->field_0x0 + lVar13) = iVar12;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  pVVar8 = p->vCos;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar9 <= lVar13) goto LAB_001db7ac;
      iVar12 = pVVar8->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_001db78d;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = p->pObjs + iVar12;
      if ((int)pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value < 0)
      goto LAB_001db7cb;
      uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar7 >> 0x1d & 1 ^
                                    pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value
                              );
      pGVar7->Value = uVar10;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar13 < (long)(uVar9 - (long)p->nRegs));
  }
  iVar12 = vFfMask->nSize;
  if (iVar12 < 1) {
    iVar11 = 0;
  }
  else {
    lVar13 = 0;
    iVar11 = 0;
    do {
      if (vFfMask->pArray[lVar13] == -1) {
        Gia_ManAppendCo(p_00,0);
      }
      else {
        if (p->nRegs <= iVar11) {
          __assert_fail("v < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d7,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
        }
        iVar12 = p->vCos->nSize;
        uVar10 = (iVar12 - p->nRegs) + iVar11;
        if (((int)uVar10 < 0) || (iVar12 <= (int)uVar10)) {
LAB_001db7ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar12 = p->vCos->pArray[uVar10];
        if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_001db78d:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar7 = p->pObjs + iVar12;
        if ((int)pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].Value < 0) {
LAB_001db7cb:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar11 = iVar11 + 1;
        uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar7 >> 0x1d & 1 ^
                                      pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].
                                      Value);
        pGVar7->Value = uVar10;
      }
      lVar13 = lVar13 + 1;
      iVar12 = vFfMask->nSize;
    } while (lVar13 < iVar12);
  }
  if (iVar11 != p->nRegs) {
    __assert_fail("k == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x394,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManSetRegNum(p_00,iVar12);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupSpreadFlop( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, Entry;
    assert( Vec_IntSize(vFfMask) >= Gia_ManRegNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCi(pNew);
        else
            Gia_ManRo(p, k++)->Value = Gia_ManAppendCi(pNew);
    assert( k == Gia_ManRegNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCo( pNew, 0 );
        else
        {
            pObj = Gia_ManRi( p, k++ );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    assert( k == Gia_ManRegNum(p) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFfMask) );
    return pNew;
}